

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void * Node_GetData(node *p,dataid Id,datatype Type)

{
  nodedata *pnVar1;
  
  pnVar1 = (nodedata *)&p->Data;
  do {
    pnVar1 = pnVar1->Next;
    if (pnVar1 == (nodedata *)0x0) {
      return (void *)0x0;
    }
  } while (pnVar1->Code != (Id << 8 | Type));
  return pnVar1 + 1;
}

Assistant:

void* Node_GetData(const node* p, dataid Id, datatype Type)
{
    uint_fast32_t Code = (Id<<DYNDATA_SHIFT)|Type;
    nodedata* i;
    for (i=p->Data;i;i=i->Next)
        if (i->Code == Code)
            return NodeData_Data(i);
    return NULL;
}